

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 utf8::
 utf16to8<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,std::back_insert_iterator<std::__cxx11::string>>
           (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
            start,__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                  end,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           result)

{
  char16_t *pcVar1;
  char16_t cVar2;
  undefined8 *puVar3;
  uint32_t cp;
  char16_t cVar4;
  
  do {
    if (start._M_current == end._M_current) {
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )result.container;
    }
    pcVar1 = start._M_current + 1;
    cVar2 = *start._M_current;
    cp = (uint32_t)(ushort)cVar2;
    cVar4 = cVar2;
    if ((cVar2 & 0xfc00U) == 0xd800) {
      if (pcVar1 == end._M_current) {
LAB_0010ebf7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = &PTR__exception_00115d90;
        *(char16_t *)(puVar3 + 1) = cVar4;
        __cxa_throw(puVar3,&invalid_utf16::typeinfo,std::exception::~exception);
      }
      cVar4 = *pcVar1;
      if (((ushort)cVar4 & 0xfc00) != 0xdc00) goto LAB_0010ebf7;
      start._M_current = start._M_current + 2;
      cp = (uint)(ushort)cVar2 * 0x400 + (uint)(ushort)cVar4 + 0xfca02400;
    }
    else {
      start._M_current = pcVar1;
      if ((cVar2 & 0xfc00U) == 0xdc00) goto LAB_0010ebf7;
    }
    result = append<std::back_insert_iterator<std::__cxx11::string>>(cp,result);
  } while( true );
}

Assistant:

octet_iterator utf16to8 (u16bit_iterator start, u16bit_iterator end, octet_iterator result)
    {
        while (start != end) {
            uint32_t cp = utf8::internal::mask16(*start++);
            // Take care of surrogate pairs first
            if (utf8::internal::is_lead_surrogate(cp)) {
                if (start != end) {
                    uint32_t trail_surrogate = utf8::internal::mask16(*start++);
                    if (utf8::internal::is_trail_surrogate(trail_surrogate))
                        cp = (cp << 10) + trail_surrogate + internal::SURROGATE_OFFSET;
                    else
                        throw invalid_utf16(static_cast<uint16_t>(trail_surrogate));
                }
                else
                    throw invalid_utf16(static_cast<uint16_t>(cp));

            }
            // Lone trail surrogate
            else if (utf8::internal::is_trail_surrogate(cp))
                throw invalid_utf16(static_cast<uint16_t>(cp));

            result = utf8::append(cp, result);
        }
        return result;
    }